

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O0

char * cmsys::regbranch(int *flagp)

{
  bool bVar1;
  uint local_34;
  char *pcStack_30;
  int flags;
  char *latest;
  char *chain;
  char *ret;
  int *flagp_local;
  
  *flagp = 0;
  ret = (char *)flagp;
  chain = regnode('\x06');
  latest = (char *)0x0;
  while( true ) {
    bVar1 = false;
    if ((*regparse != '\0') && (bVar1 = false, *regparse != '|')) {
      bVar1 = *regparse != ')';
    }
    if (!bVar1) break;
    pcStack_30 = regpiece((int *)&local_34);
    if (pcStack_30 == (char *)0x0) {
      return (char *)0x0;
    }
    *(uint *)ret = local_34 & 1 | *(uint *)ret;
    if (latest == (char *)0x0) {
      *(uint *)ret = local_34 & 4 | *(uint *)ret;
    }
    else {
      regtail(latest,pcStack_30);
    }
    latest = pcStack_30;
  }
  if (latest == (char *)0x0) {
    regnode('\t');
  }
  return chain;
}

Assistant:

static char* regbranch (int *flagp) {
    char* ret;
    char* chain;
    char* latest;
    int   flags;

    *flagp = WORST;             // Tentatively.

    ret = regnode(BRANCH);
    chain = 0;
    while (*regparse != '\0' && *regparse != '|' && *regparse != ')') {
        latest = regpiece(&flags);
        if (latest == 0)
            return (0);
        *flagp |= flags & HASWIDTH;
        if (chain == 0) // First piece.
            *flagp |= flags & SPSTART;
        else
            regtail(chain, latest);
        chain = latest;
    }
    if (chain == 0)             // Loop ran zero times.
        regnode(NOTHING);

    return (ret);
}